

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_utils.c
# Opt level: O1

void bake_create_uni_query_db(char *table_name,int field_count,char **field_names,char **query)

{
  int iVar1;
  size_t sVar2;
  char *__s;
  ulong uVar3;
  int iVar4;
  
  sVar2 = strlen(table_name);
  iVar4 = (int)sVar2 + 0x21;
  if (0 < field_count) {
    uVar3 = 0;
    do {
      sVar2 = strlen(field_names[uVar3]);
      iVar4 = iVar4 + (int)sVar2 + 7;
      uVar3 = uVar3 + 1;
    } while ((uint)field_count != uVar3);
  }
  sVar2 = (size_t)iVar4;
  __s = (char *)malloc(sVar2);
  *query = __s;
  if (__s == (char *)0x0) {
    return;
  }
  iVar4 = snprintf(__s,sVar2,"%s%s%s","CREATE TABLE IF NOT EXISTS ",table_name," ( ");
  if (1 < field_count) {
    uVar3 = 0;
    do {
      iVar1 = snprintf(*query + iVar4,sVar2,"%s TEXT, ",field_names[uVar3]);
      iVar4 = iVar4 + iVar1;
      uVar3 = uVar3 + 1;
    } while (field_count - 1U != uVar3);
  }
  iVar1 = snprintf(*query + iVar4,sVar2,"%s TEXT ",field_names[(int)(field_count - 1U)]);
  snprintf(*query + (iVar4 + iVar1),sVar2,"%s",");");
  return;
}

Assistant:

void bake_create_uni_query_db(const char *table_name, int field_count, char **field_names, char **query) {
    char *query_beginning = "CREATE TABLE IF NOT EXISTS ";
    char *query_middle = " ( ";
    char *query_ending = ");";

    int query_length = strlen(query_beginning) + strlen(table_name) + strlen(query_middle) + strlen(query_ending) + 1;
    for (int i = 0; i < field_count; i++)
        query_length += strlen(field_names[i]) + 7;

    *query = malloc(query_length * sizeof(char));
    if (*query == NULL) {
        return;
    }
    int insert_pos = 0;

    insert_pos += snprintf(*query, query_length, "%s%s%s", query_beginning, table_name, query_middle);
    for (int i = 0; i < field_count - 1; i++)
        insert_pos += snprintf(*query + insert_pos, query_length, "%s TEXT, ", field_names[i]);
    insert_pos += snprintf(*query + insert_pos, query_length, "%s TEXT ", field_names[field_count - 1]);
    insert_pos += snprintf(*query + insert_pos, query_length, "%s", query_ending);
}